

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermNode * __thiscall
glslang::HlslParseContext::transformEntryPoint
          (HlslParseContext *this,TSourceLoc *loc,TFunction *userFunction,TAttributes *attributes)

{
  int *piVar1;
  uint uVar2;
  TType *type;
  pointer ppTVar3;
  bool bVar4;
  int iVar5;
  TBuiltInVariable TVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TIntermAggregate *this_00;
  undefined4 extraout_var_06;
  TIntermAggregate *this_01;
  TParameter *this_02;
  undefined4 extraout_var_08;
  TQualifier *this_03;
  TIntermSymbol *pTVar8;
  undefined4 extraout_var_09;
  TIntermAggregate *this_04;
  undefined4 extraout_var_10;
  long lVar9;
  TIntermTyped *pTVar10;
  TIntermTyped *pTVar11;
  TIntermConstantUnion *left;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TIntermSymbol *pTVar12;
  undefined4 extraout_var_14;
  TString *pTVar13;
  TVariable *pTVar14;
  HlslParseContext *this_05;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TIntermNode *pTVar15;
  pointer ppTVar16;
  char *s;
  size_t s_00;
  int i;
  uint uVar17;
  TIntermediate *pTVar18;
  int i_1;
  ulong uVar19;
  anon_class_8_1_8991fb9c makeVariableInOut;
  pool_allocator<char> local_4f0;
  TVariable *local_4e8;
  pointer local_4e0;
  TIntermTyped *callingArgs;
  anon_class_8_1_8991fb9c isDsPcfInput;
  TVector<glslang::TVariable_*> inputs;
  TVector<glslang::TVariable_*> argVars;
  TVector<glslang::TVariable_*> outputs;
  TVariable *entryPointOutput;
  TIntermNode *synthFunctionDef;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_428 [8];
  TVector<glslang::TVariable_*> opaque_uniforms;
  TFunction synthEntryPoint;
  TFunction callee;
  TType voidType;
  undefined4 extraout_var_07;
  undefined4 extraout_var_15;
  
  isDsPcfInput.this = this;
  iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
  bVar4 = isEntrypointName(this,(TString *)CONCAT44(extraout_var,iVar5));
  if (bVar4) {
    this->entryPointFunction = userFunction;
    handleEntryPointAttributes(this,loc,attributes);
    TVector<glslang::TVariable_*>::TVector(&inputs);
    TVector<glslang::TVariable_*>::TVector(&outputs);
    remapEntryPointIO(this,userFunction,&entryPointOutput,&inputs,&outputs);
    makeVariableInOut.this = this;
    if (entryPointOutput != (TVariable *)0x0) {
      transformEntryPoint::anon_class_8_1_8991fb9c::operator()(&makeVariableInOut,entryPointOutput);
    }
    local_4e8 = entryPointOutput;
    for (ppTVar16 = inputs.
                    super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                    .
                    super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppTVar16 !=
        inputs.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar16 = ppTVar16 + 1) {
      iVar5 = (*((*ppTVar16)->super_TSymbol)._vptr_TSymbol[0xc])();
      bVar4 = transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                        (&isDsPcfInput,(TType *)CONCAT44(extraout_var_00,iVar5));
      if (!bVar4) {
        transformEntryPoint::anon_class_8_1_8991fb9c::operator()(&makeVariableInOut,*ppTVar16);
      }
    }
    for (ppTVar16 = outputs.
                    super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                    .
                    super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppTVar16 !=
        outputs.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar16 = ppTVar16 + 1) {
      transformEntryPoint::anon_class_8_1_8991fb9c::operator()(&makeVariableInOut,*ppTVar16);
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation) {
      for (ppTVar16 = inputs.
                      super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      .
                      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppTVar16 !=
          inputs.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
          super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppTVar16 = ppTVar16 + 1) {
        iVar5 = (*((*ppTVar16)->super_TSymbol)._vptr_TSymbol[0xc])();
        bVar4 = transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                          (&isDsPcfInput,(TType *)CONCAT44(extraout_var_01,iVar5));
        if (bVar4) {
          transformEntryPoint::anon_class_8_1_8991fb9c::operator()(&makeVariableInOut,*ppTVar16);
        }
      }
    }
    TVector<glslang::TVariable_*>::TVector
              ((TVector<glslang::TVariable_*> *)
               &opaque_uniforms.
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>);
    for (uVar17 = 0; iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(userFunction),
        (int)uVar17 < iVar5; uVar17 = uVar17 + 1) {
      iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,(ulong)uVar17);
      type = *(TType **)(CONCAT44(extraout_var_02,iVar5) + 8);
      iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction);
      lVar9 = *(long *)CONCAT44(extraout_var_03,iVar5);
      iVar5 = (*type->_vptr_TType[10])(type);
      if ((*(uint *)(CONCAT44(extraout_var_04,iVar5) + 8) & 0x7f) == 5) {
        iVar5 = (*type->_vptr_TType[0x36])(type);
        if ((char)iVar5 == '\0') {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x40])
                    (this,loc,type,lVar9);
        }
        else {
          synthEntryPoint.super_TSymbol._vptr_TSymbol =
               (_func_int **)makeInternalVariable(this,*(char **)(lVar9 + 8),type);
          std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
          push_back(&opaque_uniforms.
                     super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                    ,(value_type *)&synthEntryPoint);
        }
      }
    }
    pushScope(this);
    TType::TType(&voidType,EbtVoid,EvqTemporary,1,0,0,false);
    iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
    pTVar13 = (TString *)CONCAT44(extraout_var_05,iVar5);
    TFunction::TFunction(&synthEntryPoint,pTVar13,&voidType,EOpNull);
    this_00 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)pTVar13);
    TIntermAggregate::TIntermAggregate(this_00);
    TIntermediate::setAggregateOperator
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
               (TIntermNode *)this_00,EOpParameters,&voidType,loc);
    std::__cxx11::string::assign
              ((char *)&((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                        entryPointMangledName);
    piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->numEntryPoints;
    *piVar1 = *piVar1 + 1;
    iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
    TFunction::TFunction(&callee,(TString *)CONCAT44(extraout_var_06,iVar5),&voidType,EOpNull);
    s = "@";
    (*(userFunction->super_TSymbol)._vptr_TSymbol[5])(userFunction);
    TVector<glslang::TVariable_*>::TVector(&argVars);
    this_01 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)s);
    TIntermAggregate::TIntermAggregate(this_01);
    local_4e0 = opaque_uniforms.
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    callingArgs = (TIntermTyped *)0x0;
    ppTVar16 = inputs.
               super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
               super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    for (uVar17 = 0; iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(userFunction),
        (int)uVar17 < iVar5; uVar17 = uVar17 + 1) {
      iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,(ulong)uVar17);
      this_02 = (TParameter *)CONCAT44(extraout_var_07,iVar5);
      synthFunctionDef = (TIntermNode *)makeInternalVariable(this,this_02->name,this_02->type);
      std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
      emplace_back<glslang::TVariable*>
                ((vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)
                 &argVars,(TVariable **)&synthFunctionDef);
      iVar5 = (*(argVars.
                 super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                 super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]->super_TSymbol)._vptr_TSymbol[0xd])
                        ();
      this_03 = (TQualifier *)
                (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x50))
                          ((long *)CONCAT44(extraout_var_08,iVar5));
      TQualifier::makeTemporary(this_03);
      TVar6 = TParameter::getDeclaredBuiltIn(this_02);
      pTVar14 = argVars.
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1];
      if (TVar6 == EbvInputPatch) {
        this->inputPatch = pTVar14;
      }
      pTVar8 = TIntermediate::addSymbol
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar14)
      ;
      handleFunctionArgument(this,&callee,&callingArgs,&pTVar8->super_TIntermTyped);
      iVar5 = (*this_02->type->_vptr_TType[10])();
      uVar2 = *(uint *)(CONCAT44(extraout_var_09,iVar5) + 8);
      if (((uVar2 & 0x7f) < 0x14) && ((0xd0000U >> (uVar2 & 0x1f) & 1) != 0)) {
        this_04 = (TIntermAggregate *)
                  TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             *ppTVar16);
        iVar5 = (*(this_04->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(this_04);
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar5) + 0x58))
                          ((long *)CONCAT44(extraout_var_10,iVar5));
        pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        if (((*(uint *)(lVar9 + 8) & 0xff80) == 0x1f80) && (pTVar18->dxPositionW == true)) {
          local_4f0.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &synthFunctionDef,"xyz",&local_4f0);
          pTVar10 = handleDotDereference
                              (this,loc,(TIntermTyped *)this_04,(TString *)&synthFunctionDef);
          local_4f0.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &synthFunctionDef,"w",&local_4f0);
          pTVar11 = handleDotDereference
                              (this,loc,(TIntermTyped *)this_04,(TString *)&synthFunctionDef);
          left = TIntermediate::addConstantUnion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,1.0,
                            EbtFloat,loc,false);
          s_00 = 0x1c;
          pTVar11 = TIntermediate::addBinaryMath
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpDiv,&left->super_TIntermTyped,pTVar11,loc);
          this_04 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,s_00);
          TIntermAggregate::TIntermAggregate(this_04,EOpConstructVec4);
          iVar5 = (*(this_04->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(this_04);
          synthFunctionDef = &pTVar10->super_TIntermNode;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_11,iVar5),&synthFunctionDef);
          iVar5 = (*(this_04->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(this_04);
          synthFunctionDef = &pTVar11->super_TIntermNode;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_12,iVar5),&synthFunctionDef);
          TType::TType((TType *)&synthFunctionDef,EbtFloat,EvqTemporary,4,0,0,false);
          (*(this_04->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(this_04,(TType *)&synthFunctionDef);
          (*(this_04->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [1])(this_04,loc);
          pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        }
        pTVar10 = handleAssign(this,loc,EOpAssign,&pTVar8->super_TIntermTyped,
                               (TIntermTyped *)this_04);
        TIntermediate::growAggregate(pTVar18,(TIntermNode *)this_01,&pTVar10->super_TIntermNode);
        ppTVar16 = ppTVar16 + 1;
      }
      iVar5 = (*this_02->type->_vptr_TType[10])();
      if ((*(uint *)(CONCAT44(extraout_var_13,iVar5) + 8) & 0x7f) == 5) {
        iVar5 = (*this_02->type->_vptr_TType[0x36])();
        ppTVar3 = local_4e0;
        pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        if ((char)iVar5 == '\0') {
          pTVar10 = handleVariable(this,loc,this_02->name);
          pTVar10 = handleAssign(this,loc,EOpAssign,&pTVar8->super_TIntermTyped,pTVar10);
          TIntermediate::growAggregate(pTVar18,(TIntermNode *)this_01,&pTVar10->super_TIntermNode);
        }
        else {
          pTVar12 = TIntermediate::addSymbol(pTVar18,*local_4e0);
          pTVar10 = handleAssign(this,loc,EOpAssign,&pTVar8->super_TIntermTyped,
                                 &pTVar12->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar18,(TIntermNode *)this_01,&pTVar10->super_TIntermNode);
          local_4e0 = ppTVar3 + 1;
        }
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign(&this->currentCaller,&synthEntryPoint.mangledName);
    pTVar10 = handleFunctionCall(this,loc,&callee,callingArgs);
    iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[6])(userFunction);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign(&this->currentCaller,
              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              CONCAT44(extraout_var_14,iVar5));
    if (local_4e8 != (TVariable *)0x0) {
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
        pTVar8 = findTessLinkageSymbol(this,EbvInvocationId);
        if (pTVar8 == (TIntermSymbol *)0x0) {
          TType::TType((TType *)&synthFunctionDef,EbtUint,EvqIn,1,0,0,false);
          pTVar13 = NewPoolTString_abi_cxx11_("InvocationId");
          local_428[0]._0_8_ = local_428[0]._M_allocated_capacity & 0xffffffffffff007f | 0x1980;
          pTVar14 = makeInternalVariable(this,pTVar13,(TType *)&synthFunctionDef);
          iVar5 = (*(pTVar14->super_TSymbol)._vptr_TSymbol[0xd])(pTVar14);
          this_05 = (HlslParseContext *)CONCAT44(extraout_var_15,iVar5);
          iVar5 = (*(this_05->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10]
                  )();
          globalQualifierFix(this_05,(TSourceLoc *)pTVar13,
                             (TQualifier *)CONCAT44(extraout_var_16,iVar5));
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                    (this,pTVar14);
          pTVar8 = TIntermediate::addSymbol
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              pTVar14);
        }
        pTVar14 = local_4e8;
        pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar12 = TIntermediate::addSymbol(pTVar18,local_4e8);
        pTVar8 = (TIntermSymbol *)
                 TIntermediate::addIndex
                           (pTVar18,EOpIndexIndirect,&pTVar12->super_TIntermTyped,
                            &pTVar8->super_TIntermTyped,loc);
        iVar5 = (*(pTVar14->super_TSymbol)._vptr_TSymbol[0xc])(pTVar14);
        TType::TType((TType *)&synthFunctionDef,(TType *)CONCAT44(extraout_var_17,iVar5),0,false);
        (*(pTVar8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
                  (pTVar8,(TType *)&synthFunctionDef);
      }
      else {
        pTVar8 = TIntermediate::addSymbol
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            local_4e8);
      }
      pTVar10 = handleAssign(this,loc,EOpAssign,&pTVar8->super_TIntermTyped,pTVar10);
    }
    TIntermediate::growAggregate
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
               (TIntermNode *)this_01,&pTVar10->super_TIntermNode);
    ppTVar16 = outputs.
               super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
               super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    for (uVar19 = 0; iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(userFunction),
        (long)uVar19 < (long)iVar5; uVar19 = uVar19 + 1) {
      iVar5 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,uVar19 & 0xffffffff)
      ;
      iVar7 = (*((TParameter *)CONCAT44(extraout_var_18,iVar5))->type->_vptr_TType[10])();
      if ((*(uint *)(CONCAT44(extraout_var_19,iVar7) + 8) & 0x7f) - 0x11 < 2) {
        TVar6 = TParameter::getDeclaredBuiltIn((TParameter *)CONCAT44(extraout_var_18,iVar5));
        if (TVar6 == EbvGsOutputStream) {
          this->gsStreamOutput = *ppTVar16;
        }
        else {
          pTVar18 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar8 = TIntermediate::addSymbol(pTVar18,*ppTVar16);
          pTVar12 = TIntermediate::addSymbol
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               argVars.
                               super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                               .
                               super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar19]);
          pTVar10 = handleAssign(this,loc,EOpAssign,&pTVar8->super_TIntermTyped,
                                 &pTVar12->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar18,(TIntermNode *)this_01,&pTVar10->super_TIntermNode);
        }
        ppTVar16 = ppTVar16 + 1;
      }
    }
    (*(this_01->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (this_01,1);
    synthFunctionDef = (TIntermNode *)this_00;
    handleFunctionBody(this,loc,&synthEntryPoint,(TIntermNode *)this_01,&synthFunctionDef);
    pTVar15 = synthFunctionDef;
    this->entryPointFunctionBody = (TIntermNode *)this_01;
    TFunction::~TFunction(&callee);
    TFunction::~TFunction(&synthEntryPoint);
  }
  else {
    remapNonEntryPointIO(this,userFunction);
    pTVar15 = (TIntermNode *)0x0;
  }
  return pTVar15;
}

Assistant:

TIntermNode* HlslParseContext::transformEntryPoint(const TSourceLoc& loc, TFunction& userFunction,
                                                   const TAttributes& attributes)
{
    // Return true if this is a tessellation patch constant function input to a domain shader.
    const auto isDsPcfInput = [this](const TType& type) {
        return language == EShLangTessEvaluation &&
        type.contains([](const TType* t) {
                return t->getQualifier().builtIn == EbvTessLevelOuter ||
                       t->getQualifier().builtIn == EbvTessLevelInner;
            });
    };

    // if we aren't in the entry point, fix the IO as such and exit
    if (! isEntrypointName(userFunction.getName())) {
        remapNonEntryPointIO(userFunction);
        return nullptr;
    }

    entryPointFunction = &userFunction; // needed in finish()

    // Handle entry point attributes
    handleEntryPointAttributes(loc, attributes);

    // entry point logic...

    // Move parameters and return value to shader in/out
    TVariable* entryPointOutput; // gets created in remapEntryPointIO
    TVector<TVariable*> inputs;
    TVector<TVariable*> outputs;
    remapEntryPointIO(userFunction, entryPointOutput, inputs, outputs);

    // Further this return/in/out transform by flattening, splitting, and assigning locations
    const auto makeVariableInOut = [&](TVariable& variable) {
        if (variable.getType().isStruct()) {
            bool arrayed = variable.getType().getQualifier().isArrayedIo(language);
            flatten(variable, false /* don't track linkage here, it will be tracked in assignToInterface() */, arrayed);
        }
        // TODO: flatten arrays too
        // TODO: flatten everything in I/O
        // TODO: replace all split with flatten, make all paths can create flattened I/O, then split code can be removed

        // For clip and cull distance, multiple output variables potentially get merged
        // into one in assignClipCullDistance.  That code in assignClipCullDistance
        // handles the interface logic, so we avoid it here in that case.
        if (!isClipOrCullDistance(variable.getType()))
            assignToInterface(variable);
    };
    if (entryPointOutput != nullptr)
        makeVariableInOut(*entryPointOutput);
    for (auto it = inputs.begin(); it != inputs.end(); ++it)
        if (!isDsPcfInput((*it)->getType()))  // wait until the end for PCF input (see comment below)
            makeVariableInOut(*(*it));
    for (auto it = outputs.begin(); it != outputs.end(); ++it)
        makeVariableInOut(*(*it));

    // In the domain shader, PCF input must be at the end of the linkage.  That's because in the
    // hull shader there is no ordering: the output comes from the separate PCF, which does not
    // participate in the argument list.  That is always put at the end of the HS linkage, so the
    // input side of the DS must match.  The argument may be in any position in the DS argument list
    // however, so this ensures the linkage is built in the correct order regardless of argument order.
    if (language == EShLangTessEvaluation) {
        for (auto it = inputs.begin(); it != inputs.end(); ++it)
            if (isDsPcfInput((*it)->getType()))
                makeVariableInOut(*(*it));
    }

    // Add uniform parameters to the $Global uniform block.
    TVector<TVariable*> opaque_uniforms;
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TType& paramType = *userFunction[i].type;
        TString& paramName = *userFunction[i].name;
        if (paramType.getQualifier().storage == EvqUniform) {
            if (!paramType.containsOpaque()) {
                // Add it to the global uniform block.
                growGlobalUniformBlock(loc, paramType, paramName);
            } else {
                // Declare it as a separate variable.
                TVariable *var = makeInternalVariable(paramName.c_str(), paramType);
                opaque_uniforms.push_back(var);
            }
        }
    }

    // Synthesize the call

    pushScope(); // matches the one in handleFunctionBody()

    // new signature
    TType voidType(EbtVoid);
    TFunction synthEntryPoint(&userFunction.getName(), voidType);
    TIntermAggregate* synthParams = new TIntermAggregate();
    intermediate.setAggregateOperator(synthParams, EOpParameters, voidType, loc);
    intermediate.setEntryPointMangledName(synthEntryPoint.getMangledName().c_str());
    intermediate.incrementEntryPointCount();
    TFunction callee(&userFunction.getName(), voidType); // call based on old name, which is still in the symbol table

    // change original name
    userFunction.addPrefix("@");                         // change the name in the function, but not in the symbol table

    // Copy inputs (shader-in -> calling arg), while building up the call node
    TVector<TVariable*> argVars;
    TIntermAggregate* synthBody = new TIntermAggregate();
    auto inputIt = inputs.begin();
    auto opaqueUniformIt = opaque_uniforms.begin();
    TIntermTyped* callingArgs = nullptr;

    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];
        argVars.push_back(makeInternalVariable(*param.name, *param.type));
        argVars.back()->getWritableType().getQualifier().makeTemporary();

        // Track the input patch, which is the only non-builtin supported by hull shader PCF.
        if (param.getDeclaredBuiltIn() == EbvInputPatch)
            inputPatch = argVars.back();

        TIntermSymbol* arg = intermediate.addSymbol(*argVars.back());
        handleFunctionArgument(&callee, callingArgs, arg);
        if (param.type->getQualifier().isParamInput()) {
            TIntermTyped* input = intermediate.addSymbol(**inputIt);
            if (input->getType().getQualifier().builtIn == EbvFragCoord && intermediate.getDxPositionW()) {
                // Replace FragCoord W with reciprocal
                auto pos_xyz = handleDotDereference(loc, input, "xyz");
                auto pos_w   = handleDotDereference(loc, input, "w");
                auto one     = intermediate.addConstantUnion(1.0, EbtFloat, loc);
                auto recip_w = intermediate.addBinaryMath(EOpDiv, one, pos_w, loc);
                TIntermAggregate* dst = new TIntermAggregate(EOpConstructVec4);
                dst->getSequence().push_back(pos_xyz);
                dst->getSequence().push_back(recip_w);
                dst->setType(TType(EbtFloat, EvqTemporary, 4));
                dst->setLoc(loc);
                input = dst;
            }
            intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg, input));
            inputIt++;
        }
        if (param.type->getQualifier().storage == EvqUniform) {
            if (!param.type->containsOpaque()) {
                // Look it up in the $Global uniform block.
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   handleVariable(loc, param.name)));
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   intermediate.addSymbol(**opaqueUniformIt)));
                ++opaqueUniformIt;
            }
        }
    }

    // Call
    currentCaller = synthEntryPoint.getMangledName();
    TIntermTyped* callReturn = handleFunctionCall(loc, &callee, callingArgs);
    currentCaller = userFunction.getMangledName();

    // Return value
    if (entryPointOutput) {
        TIntermTyped* returnAssign;

        // For hull shaders, the wrapped entry point return value is written to
        // an array element as indexed by invocation ID, which we might have to make up.
        // This is required to match SPIR-V semantics.
        if (language == EShLangTessControl) {
            TIntermSymbol* invocationIdSym = findTessLinkageSymbol(EbvInvocationId);

            // If there is no user declared invocation ID, we must make one.
            if (invocationIdSym == nullptr) {
                TType invocationIdType(EbtUint, EvqIn, 1);
                TString* invocationIdName = NewPoolTString("InvocationId");
                invocationIdType.getQualifier().builtIn = EbvInvocationId;

                TVariable* variable = makeInternalVariable(*invocationIdName, invocationIdType);

                globalQualifierFix(loc, variable->getWritableType().getQualifier());
                trackLinkage(*variable);

                invocationIdSym = intermediate.addSymbol(*variable);
            }

            TIntermTyped* element = intermediate.addIndex(EOpIndexIndirect, intermediate.addSymbol(*entryPointOutput),
                                                          invocationIdSym, loc);

            // Set the type of the array element being dereferenced
            const TType derefElementType(entryPointOutput->getType(), 0);
            element->setType(derefElementType);

            returnAssign = handleAssign(loc, EOpAssign, element, callReturn);
        } else {
            returnAssign = handleAssign(loc, EOpAssign, intermediate.addSymbol(*entryPointOutput), callReturn);
        }
        intermediate.growAggregate(synthBody, returnAssign);
    } else
        intermediate.growAggregate(synthBody, callReturn);

    // Output copies
    auto outputIt = outputs.begin();
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];

        // GS outputs are via emit, so we do not copy them here.
        if (param.type->getQualifier().isParamOutput()) {
            if (param.getDeclaredBuiltIn() == EbvGsOutputStream) {
                // GS output stream does not assign outputs here: it's the Append() method
                // which writes to the output, probably multiple times separated by Emit.
                // We merely remember the output to use, here.
                gsStreamOutput = *outputIt;
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign,
                                                                   intermediate.addSymbol(**outputIt),
                                                                   intermediate.addSymbol(*argVars[i])));
            }

            outputIt++;
        }
    }

    // Put the pieces together to form a full function subtree
    // for the synthesized entry point.
    synthBody->setOperator(EOpSequence);
    TIntermNode* synthFunctionDef = synthParams;
    handleFunctionBody(loc, synthEntryPoint, synthBody, synthFunctionDef);

    entryPointFunctionBody = synthBody;

    return synthFunctionDef;
}